

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DelaySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DelaySyntax,slang::syntax::SyntaxKind_const&,slang::parsing::Token,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1,ExpressionSyntax *args_2)

{
  Token hash;
  DelaySyntax *pDVar1;
  DelaySyntax *in_RCX;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  
  pDVar1 = (DelaySyntax *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  hash.info = in_RSI;
  hash._0_8_ = in_RDX;
  slang::syntax::DelaySyntax::DelaySyntax
            (in_RCX,(SyntaxKind)((ulong)in_RDX->endPtr >> 0x20),hash,
             (ExpressionSyntax *)in_RDX->head);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }